

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLinLog>::
operator()(ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLinLog>
           *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  int iVar8;
  int iVar9;
  GetterXsYs<int> *pGVar10;
  TransformerLinLog *pTVar11;
  ImPlotPlot *pIVar12;
  GetterXsYRef<int> *pGVar13;
  ImDrawVert *pIVar14;
  ImDrawIdx *pIVar15;
  double dVar16;
  ImVec2 IVar17;
  ushort uVar18;
  ImPlotContext *pIVar19;
  ImPlotContext *pIVar20;
  bool bVar21;
  long lVar22;
  ImDrawIdx IVar23;
  uint uVar24;
  float fVar25;
  float fVar26;
  ImVec2 IVar27;
  float fVar28;
  ImVec2 IVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  
  pIVar19 = GImPlot;
  pGVar10 = this->Getter1;
  pTVar11 = this->Transformer;
  iVar8 = pGVar10->Count;
  lVar22 = (long)(((pGVar10->Offset + prim + 1) % iVar8 + iVar8) % iVar8) * (long)pGVar10->Stride;
  iVar8 = *(int *)((long)pGVar10->Xs + lVar22);
  dVar16 = log10((double)*(int *)((long)pGVar10->Ys + lVar22) /
                 GImPlot->CurrentPlot->YAxis[pTVar11->YAxis].Range.Min);
  pIVar20 = GImPlot;
  iVar9 = pTVar11->YAxis;
  pIVar12 = pIVar19->CurrentPlot;
  dVar7 = pIVar12->YAxis[iVar9].Range.Min;
  fVar26 = (float)(((double)iVar8 - (pIVar12->XAxis).Range.Min) * pIVar19->Mx +
                  (double)pIVar19->PixelRange[iVar9].Min.x);
  fVar25 = (float)((((double)(float)(dVar16 / pIVar19->LogDenY[iVar9]) *
                     (pIVar12->YAxis[iVar9].Range.Max - dVar7) + dVar7) - dVar7) *
                   pIVar19->My[iVar9] + (double)pIVar19->PixelRange[iVar9].Min.y);
  pGVar13 = this->Getter2;
  pTVar11 = this->Transformer;
  iVar8 = pGVar13->Count;
  iVar8 = *(int *)((long)pGVar13->Xs +
                  (long)(((prim + 1 + pGVar13->Offset) % iVar8 + iVar8) % iVar8) *
                  (long)pGVar13->Stride);
  dVar16 = log10(pGVar13->YRef / GImPlot->CurrentPlot->YAxis[pTVar11->YAxis].Range.Min);
  iVar9 = pTVar11->YAxis;
  pIVar12 = pIVar20->CurrentPlot;
  dVar7 = pIVar12->YAxis[iVar9].Range.Min;
  fVar30 = (float)(((double)iVar8 - (pIVar12->XAxis).Range.Min) * pIVar20->Mx +
                  (double)pIVar20->PixelRange[iVar9].Min.x);
  fVar32 = (float)((((double)(float)(dVar16 / pIVar20->LogDenY[iVar9]) *
                     (pIVar12->YAxis[iVar9].Range.Max - dVar7) + dVar7) - dVar7) *
                   pIVar20->My[iVar9] + (double)pIVar20->PixelRange[iVar9].Min.y);
  fVar2 = (this->P11).x;
  fVar3 = (this->P11).y;
  fVar4 = (this->P12).x;
  fVar5 = (this->P12).y;
  fVar28 = fVar3;
  if (fVar5 <= fVar3) {
    fVar28 = fVar5;
  }
  if (fVar25 <= fVar28) {
    fVar28 = fVar25;
  }
  if (fVar32 <= fVar28) {
    fVar28 = fVar32;
  }
  bVar21 = false;
  if ((fVar28 < (cull_rect->Max).y) &&
     (fVar28 = (float)(~-(uint)(fVar5 <= fVar3) & (uint)fVar5 |
                      -(uint)(fVar5 <= fVar3) & (uint)fVar3), uVar24 = -(uint)(fVar25 <= fVar28),
     fVar28 = (float)(~uVar24 & (uint)fVar25 | uVar24 & (uint)fVar28),
     uVar24 = -(uint)(fVar32 <= fVar28),
     fVar28 = (float)(~uVar24 & (uint)fVar32 | uVar24 & (uint)fVar28), pfVar1 = &(cull_rect->Min).y,
     *pfVar1 <= fVar28 && fVar28 != *pfVar1)) {
    fVar28 = fVar2;
    if (fVar4 <= fVar2) {
      fVar28 = fVar4;
    }
    if (fVar26 <= fVar28) {
      fVar28 = fVar26;
    }
    if (fVar30 <= fVar28) {
      fVar28 = fVar30;
    }
    bVar21 = false;
    if (fVar28 < (cull_rect->Max).x) {
      fVar28 = (float)(~-(uint)(fVar4 <= fVar2) & (uint)fVar4 |
                      -(uint)(fVar4 <= fVar2) & (uint)fVar2);
      uVar24 = -(uint)(fVar26 <= fVar28);
      fVar28 = (float)(~uVar24 & (uint)fVar26 | uVar24 & (uint)fVar28);
      uVar24 = -(uint)(fVar30 <= fVar28);
      fVar28 = (float)(~uVar24 & (uint)fVar30 | uVar24 & (uint)fVar28);
      bVar21 = (cull_rect->Min).x <= fVar28 && fVar28 != (cull_rect->Min).x;
    }
  }
  IVar27.y = fVar25;
  IVar27.x = fVar26;
  IVar29.y = fVar32;
  IVar29.x = fVar30;
  if (bVar21 != false) {
    fVar28 = (this->P11).y;
    fVar6 = (this->P12).y;
    fVar34 = fVar2 * fVar25 - fVar26 * fVar3;
    fVar33 = fVar4 * fVar32 - fVar30 * fVar5;
    fVar31 = (fVar2 - fVar26) * (fVar5 - fVar32) - (fVar4 - fVar30) * (fVar3 - fVar25);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14->col = this->Col;
    pIVar14[1].pos = IVar27;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[1].col = this->Col;
    IVar17.y = ((fVar5 - fVar32) * fVar34 - (fVar3 - fVar25) * fVar33) / fVar31;
    IVar17.x = (fVar34 * (fVar4 - fVar30) - (fVar2 - fVar26) * fVar33) / fVar31;
    pIVar14[2].pos = IVar17;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[2].col = this->Col;
    pIVar14[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[3].col = this->Col;
    pIVar14[4].pos = IVar29;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar14 + 5;
    uVar24 = DrawList->_VtxCurrentIdx;
    pIVar15 = DrawList->_IdxWritePtr;
    IVar23 = (ImDrawIdx)uVar24;
    *pIVar15 = IVar23;
    uVar18 = -(ushort)(fVar6 < fVar28 && fVar25 < fVar32 || fVar28 < fVar6 && fVar32 < fVar25) & 1;
    pIVar15[1] = IVar23 + uVar18 + 1;
    pIVar15[2] = IVar23 + 3;
    pIVar15[3] = IVar23 + 1;
    pIVar15[4] = (uVar18 ^ 3) + IVar23;
    pIVar15[5] = IVar23 + 4;
    DrawList->_IdxWritePtr = pIVar15 + 6;
    DrawList->_VtxCurrentIdx = uVar24 + 5;
  }
  this->P11 = IVar27;
  this->P12 = IVar29;
  return bVar21;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }